

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Option::_validate(string *__return_storage_ptr__,Option *this,string *result)

{
  bool bVar1;
  ulong uVar2;
  ValidationError *err;
  string local_68;
  reference local_48;
  Validator *vali;
  iterator __end2;
  iterator __begin2;
  vector<CLI::Validator,_std::allocator<CLI::Validator>_> *__range2;
  string *result_local;
  Option *this_local;
  string *err_msg;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end2 = std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::begin(&this->validators_);
  vali = (Validator *)
         std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::end(&this->validators_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
                                *)&vali);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    local_48 = __gnu_cxx::
               __normal_iterator<CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
               ::operator*(&__end2);
    Validator::operator()(&local_68,local_48,result);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_68);
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string _validate(std::string &result) {
        std::string err_msg;
        for(const auto &vali : validators_) {
            try {
                err_msg = vali(result);
            } catch(const ValidationError &err) {
                err_msg = err.what();
            }
            if(!err_msg.empty())
                break;
        }
        return err_msg;
    }